

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O2

JSONObject * __thiscall
Js::JSONStringifier::ReadObject
          (JSONStringifier *this,RecyclableObject *obj,JSONObjectStack *objectStack)

{
  Recycler *this_00;
  code *pcVar1;
  undefined1 auVar2 [8];
  bool bVar3;
  uint32 uVar4;
  int iVar5;
  uint32 uVar6;
  Recycler *alloc;
  PropertyRecord *pPVar7;
  undefined4 *puVar8;
  Type *pTVar9;
  JavascriptProxy *proxyObject;
  EnumeratorCache *pEVar10;
  JavascriptString *propertyString;
  ScriptContext *pSVar11;
  JSONStringifier *this_01;
  undefined1 local_a8 [8];
  TrackAllocData data;
  JSONObjectStack local_60;
  JSONStringifier *local_50;
  SListNodeBase<Memory::Recycler> local_48;
  PropertyRecord *propertyRecord;
  PropertyId local_38;
  uint32 local_34;
  PropertyId nextKey;
  
  bVar3 = JSONObjectStack::Has(objectStack,obj);
  if (bVar3) {
    JavascriptError::ThrowTypeError(this->scriptContext,-0x7ff5ec56,(PCWSTR)0x0);
  }
  uVar6 = this->indentLength;
  local_60.object = obj;
  local_60.next = objectStack;
  if (this->gapLength != 0) {
    uVar4 = UInt32Math::Add(uVar6,this->gapLength);
    this->indentLength = uVar4;
  }
  this_00 = this->scriptContext->recycler;
  local_a8 = (undefined1  [8])&SListCounted<Js::JSONObjectProperty,Memory::Recycler>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_68a3be2;
  data.filename._0_4_ = 0x23a;
  alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_a8);
  pPVar7 = (PropertyRecord *)new<Memory::Recycler>(0x18,alloc,0x37a1d4);
  SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>::SListBase
            ((SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *)pPVar7);
  *(Recycler **)&pPVar7->isNumeric = this_00;
  pSVar11 = (ScriptContext *)this->propertyList;
  local_50 = this;
  propertyRecord = pPVar7;
  if (pSVar11 == (ScriptContext *)0x0) {
    bVar3 = VarIsImpl<Js::JavascriptProxy>(obj);
    if ((bVar3) &&
       (proxyObject = UnsafeVarTo<Js::JavascriptProxy,Js::RecyclableObject>(obj), this_01 = local_50
       , proxyObject != (JavascriptProxy *)0x0)) {
      ReadProxy(local_50,proxyObject,(JSONObject *)propertyRecord,&local_60);
    }
    else {
      JavascriptStaticEnumerator::JavascriptStaticEnumerator((JavascriptStaticEnumerator *)local_a8)
      ;
      this_01 = local_50;
      pEVar10 = JavascriptLibrary::GetStringifyCache
                          ((local_50->scriptContext->super_ScriptContextBase).javascriptLibrary,
                           (obj->type).ptr);
      iVar5 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x2b])
                        (obj,(JavascriptStaticEnumerator *)local_a8,0x1c,this_01->scriptContext,
                         pEVar10);
      if (iVar5 != 0) {
        local_38 = -1;
        local_34 = uVar6;
        while (propertyString =
                    JavascriptStaticEnumerator::MoveAndGetNext
                              ((JavascriptStaticEnumerator *)local_a8,&local_38,
                               (PropertyAttributes *)0x0), uVar6 = local_34,
              propertyString != (JavascriptString *)0x0) {
          uVar6 = JavascriptStaticEnumerator::GetCurrentItemIndex
                            ((JavascriptStaticEnumerator *)local_a8);
          if (uVar6 == 0xffffffff) {
            local_48.next.ptr = (Type)(SListNodeBase<Memory::Recycler> *)0x0;
            if (local_38 == -1) {
              ScriptContext::GetOrAddPropertyRecord
                        (this_01->scriptContext,propertyString,(PropertyRecord **)&local_48);
              local_38 = *(Type *)((long)local_48.next.ptr + 8);
            }
            ReadObjectElement(this_01,propertyString,(PropertyRecord *)local_48.next.ptr,obj,
                              (JSONObject *)propertyRecord,&local_60);
          }
          else {
            ReadObjectElement(this_01,propertyString,uVar6,obj,(JSONObject *)propertyRecord,
                              &local_60);
          }
        }
      }
    }
  }
  else {
    local_a8 = (undefined1  [8])pSVar11;
    data.typeinfo = (type_info *)pSVar11;
    local_34 = uVar6;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while( true ) {
      if (pSVar11 == (ScriptContext *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar8 = 0;
      }
      auVar2 = local_a8;
      SListNodeBase<Memory::Recycler>::Next(&local_48);
      this_01 = local_50;
      uVar6 = local_34;
      if (local_48.next.ptr == (Type)auVar2) break;
      SListNodeBase<Memory::Recycler>::Next(&local_48);
      data.typeinfo = (type_info *)local_48.next.ptr;
      pTVar9 = SListBase<Js::JSONStringifier::PropertyListElement,_Memory::Recycler,_RealCount>::
               Iterator::Data((Iterator *)local_a8);
      ReadObjectElement(local_50,(pTVar9->propertyName).ptr,(pTVar9->propertyRecord).ptr,obj,
                        (JSONObject *)propertyRecord,&local_60);
      pSVar11 = (ScriptContext *)data.typeinfo;
    }
  }
  pPVar7 = propertyRecord;
  SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>::Reverse
            ((SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *)propertyRecord);
  CalculateStringifiedLength(this_01,pPVar7->pid,uVar6);
  this_01->indentLength = uVar6;
  return (JSONObject *)pPVar7;
}

Assistant:

JSONObject*
JSONStringifier::ReadObject(_In_ RecyclableObject* obj, _In_ JSONObjectStack* objectStack)
{
    if (objectStack->Has(obj))
    {
        JavascriptError::ThrowTypeError(this->scriptContext, JSERR_JSONSerializeCircular);
    }
    JSONObjectStack stack = { 0 };
    stack.next = objectStack;
    stack.object = obj;

    // Increase indentation
    const charcount_t stepbackLength = this->indentLength;
    if (this->gapLength != 0)
    {
        this->indentLength = UInt32Math::Add(this->indentLength, this->gapLength);
    }

    Recycler* recycler = this->scriptContext->GetRecycler();
    JSONObject* jsonObject = RecyclerNew(recycler, JSONObject, recycler);

    // If we are given a property list, we should only read the listed properties
    if (this->propertyList != nullptr)
    {
        FOREACH_SLIST_ENTRY(PropertyListElement, entry, this->propertyList)
        {
            this->ReadObjectElement(entry.propertyName, entry.propertyRecord, obj, jsonObject, &stack);
        }
        NEXT_SLIST_ENTRY;
    }
    else
    {
        // Enumerating proxies is different than normal objects, so enumerate them separately
        JavascriptProxy* proxyObject = JavascriptOperators::TryFromVar<JavascriptProxy>(obj);
        if (proxyObject != nullptr)
        {
            this->ReadProxy(proxyObject, jsonObject, &stack);
        }
        else
        {
            JavascriptStaticEnumerator enumerator;
            EnumeratorCache* cache = this->scriptContext->GetLibrary()->GetStringifyCache(obj->GetType());
            if (obj->GetEnumerator(&enumerator, EnumeratorFlags::SnapShotSemantics | EnumeratorFlags::EphemeralReference | EnumeratorFlags::UseCache, this->scriptContext, cache))
            {
                JavascriptString* propertyName = nullptr;
                PropertyId nextKey = Constants::NoProperty;
                while ((propertyName = enumerator.MoveAndGetNext(nextKey)) != nullptr)
                {
                    const uint32 numericIndex = enumerator.GetCurrentItemIndex();
                    if (numericIndex != Constants::InvalidSourceIndex)
                    {
                        this->ReadObjectElement(propertyName, numericIndex, obj, jsonObject, &stack);
                    }
                    else
                    {
                        PropertyRecord const * propertyRecord = nullptr;
                        if (nextKey == Constants::NoProperty)
                        {
                            this->scriptContext->GetOrAddPropertyRecord(propertyName, &propertyRecord);
                            nextKey = propertyRecord->GetPropertyId();
                        }
                        this->ReadObjectElement(propertyName, propertyRecord, obj, jsonObject, &stack);
                    }
                }
            }
        }
    }
    // JSONObject is an SList, which only has push/pop, so need to reverse list for it to be in order
    jsonObject->Reverse();
    const uint propertyCount = jsonObject->Count();

    this->CalculateStringifiedLength(propertyCount, stepbackLength);

    // Restore indent level
    this->indentLength = stepbackLength;

    return jsonObject;
}